

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_manager.cc
# Opt level: O1

bool __thiscall
xsettingsd::SettingsManager::CreateWindow
          (SettingsManager *this,int screen,Window *win_out,Time *timestamp_out)

{
  Display *pDVar1;
  char *pcVar2;
  Window WVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  size_t sVar6;
  bool bVar7;
  pid_t pid;
  XEvent event;
  XSetWindowAttributes attr;
  
  if (win_out == (Window *)0x0) {
    __assert_fail("win_out",
                  "/workspace/llm4binary/github/license_c_cmakelists/derat[P]xsettingsd/settings_manager.cc"
                  ,0xb5,"bool xsettingsd::SettingsManager::CreateWindow(int, Window *, Time *)");
  }
  if (timestamp_out != (Time *)0x0) {
    if (screen < 0) {
      bVar7 = false;
    }
    else {
      pDVar1 = this->display_;
      bVar7 = false;
      if (screen < *(int *)(pDVar1 + 0xe4)) {
        attr.override_redirect = 1;
        WVar3 = XCreateWindow(pDVar1,*(undefined8 *)
                                      (*(long *)(pDVar1 + 0xe8) + 0x10 + (ulong)(uint)screen * 0x80)
                              ,0xffffffff,0xffffffff,1,1,0,0,1,0,0x200,&attr);
        bVar7 = WVar3 != 0;
        if (bVar7) {
          *win_out = WVar3;
          XSetWMProperties(this->display_,WVar3,0,0,0,0,0,0,0);
          XStoreName(this->display_,WVar3,kProgName);
          pDVar1 = this->display_;
          uVar4 = XInternAtom(pDVar1,"_NET_WM_NAME",0);
          uVar5 = XInternAtom(this->display_,"UTF8_STRING",0);
          pcVar2 = kProgName;
          sVar6 = strlen(kProgName);
          XChangeProperty(pDVar1,WVar3,uVar4,uVar5,8,0,pcVar2,sVar6);
          pid = getpid();
          XSelectInput(this->display_,WVar3,0x400000);
          pDVar1 = this->display_;
          uVar4 = XInternAtom(pDVar1,"_NET_WM_PID",0);
          XChangeProperty(pDVar1,WVar3,uVar4,6,0x20,0,&pid,1);
          XSelectInput(this->display_,WVar3,0);
          do {
            XWindowEvent(this->display_,WVar3,0x400000,&event);
          } while (event.type != 0x1c);
          *timestamp_out = event.xkey.subwindow;
        }
      }
    }
    return bVar7;
  }
  __assert_fail("timestamp_out",
                "/workspace/llm4binary/github/license_c_cmakelists/derat[P]xsettingsd/settings_manager.cc"
                ,0xb6,"bool xsettingsd::SettingsManager::CreateWindow(int, Window *, Time *)");
}

Assistant:

bool SettingsManager::CreateWindow(int screen,
                                   Window* win_out,
                                   Time* timestamp_out) {
  assert(win_out);
  assert(timestamp_out);

  if (screen < 0 || screen >= ScreenCount(display_))
    return false;

  XSetWindowAttributes attr;
  attr.override_redirect = True;
  Window win = XCreateWindow(display_,
                             RootWindow(display_, screen),  // parent
                             -1, -1,                        // x, y
                             1, 1,                          // width, height
                             0,                             // border_width
                             CopyFromParent,                // depth
                             InputOutput,                   // class
                             CopyFromParent,                // visual
                             CWOverrideRedirect,            // attr_mask
                             &attr);
  if (win == None)
    return false;
  *win_out = win;

  // This sets a few properties for us, including WM_CLIENT_MACHINE.
  XSetWMProperties(display_,
                   win,
                   NULL,   // window_name
                   NULL,   // icon_name
                   NULL,   // argv
                   0,      // argc
                   NULL,   // normal_hints
                   NULL,   // wm_hints
                   NULL);  // class_hints

  XStoreName(display_, win, kProgName);
  XChangeProperty(display_,
                  win,
                  XInternAtom(display_, "_NET_WM_NAME", False),  // property
                  XInternAtom(display_, "UTF8_STRING", False),   // type
                  8,  // format (bits per element)
                  PropModeReplace,
                  reinterpret_cast<const unsigned char*>(kProgName),
                  strlen(kProgName));

  // Grab a timestamp from our final property change; we'll need it later
  // when announcing that we've taken the manager selection.
  pid_t pid = getpid();
  XSelectInput(display_, win, PropertyChangeMask);
  XChangeProperty(display_,
                  win,
                  XInternAtom(display_, "_NET_WM_PID", False),  // property
                  XA_CARDINAL,  // type
                  32,           // format (bits per element)
                  PropModeReplace,
                  reinterpret_cast<const unsigned char*>(&pid), // value
                  1);           // num elements
  XSelectInput(display_, win, NoEventMask);

  XEvent event;
  while (true) {
    XWindowEvent(display_, win, PropertyChangeMask, &event);
    if (event.type == PropertyNotify) {
      *timestamp_out = event.xproperty.time;
      break;
    }
  }

  return true;
}